

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetInputSourceLocalizedName
                   (XrSession session,XrInputSourceLocalizedNameGetInfo *getInfo,
                   uint32_t bufferCapacityInput,uint32_t *bufferCountOutput,char *buffer)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_519;
  string local_518 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4f8;
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_468;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3d8;
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_320;
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  GenValidUsageXrInstanceInfo *local_2b8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_290 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  XrSession_T local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_5c;
  undefined1 local_58 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  char *buffer_local;
  uint32_t *bufferCountOutput_local;
  uint32_t bufferCapacityInput_local;
  XrInputSourceLocalizedNameGetInfo *getInfo_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  getInfo_local = (XrInputSourceLocalizedNameGetInfo *)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  local_5c = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_58
             ,(XrSession_T **)&getInfo_local,&local_5c);
  VVar1 = VerifyXrSessionHandle((XrSession *)&getInfo_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)getInfo_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2b8 = pGVar2;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (getInfo == (XrInputSourceLocalizedNameGetInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d8,"VUID-xrGetInputSourceLocalizedName-getInfo-parameter",&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"xrGetInputSourceLocalizedName",&local_301);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_320,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_340,
                 "Invalid NULL for XrInputSourceLocalizedNameGetInfo \"getInfo\" which is not optional and must be non-NULL"
                 ,&local_341);
      CoreValidLogMessage(pGVar2,(string *)local_2d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_300,&local_320,(string *)local_340);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_320);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"xrGetInputSourceLocalizedName",&local_369);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_368,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_58,true,true,getInfo);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      pGVar2 = local_2b8;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if ((bufferCapacityInput == 0) || (buffer != (char *)0x0)) {
          if (bufferCountOutput == (uint32_t *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_4b0,"VUID-xrGetInputSourceLocalizedName-bufferCountOutput-parameter",
                       &local_4b1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4d8,"xrGetInputSourceLocalizedName",&local_4d9);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_4f8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_518,
                       "Invalid NULL for uint32_t \"bufferCountOutput\" which is not optional and must be non-NULL"
                       ,&local_519);
            CoreValidLogMessage(pGVar2,(string *)local_4b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                (string *)local_4d8,&local_4f8,(string *)local_518);
            std::__cxx11::string::~string(local_518);
            std::allocator<char>::~allocator((allocator<char> *)&local_519);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_4f8);
            std::__cxx11::string::~string(local_4d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
            std::__cxx11::string::~string(local_4b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
            session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
            info_with_instance.second._4_4_ = 1;
          }
          else {
            session_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_420,"VUID-xrGetInputSourceLocalizedName-buffer-parameter",&local_421);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_448,"xrGetInputSourceLocalizedName",&local_449);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_468,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_488,
                     "Command xrGetInputSourceLocalizedName param buffer is NULL, but bufferCapacityInput is greater than 0"
                     ,&local_489);
          CoreValidLogMessage(pGVar2,(string *)local_420,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_448,&local_468,(string *)local_488);
          std::__cxx11::string::~string(local_488);
          std::allocator<char>::~allocator((allocator<char> *)&local_489);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_468);
          std::__cxx11::string::~string(local_448);
          std::allocator<char>::~allocator((allocator<char> *)&local_449);
          std::__cxx11::string::~string(local_420);
          std::allocator<char>::~allocator((allocator<char> *)&local_421);
          session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_390,"VUID-xrGetInputSourceLocalizedName-getInfo-parameter",&local_391);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"xrGetInputSourceLocalizedName",&local_3b9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3d8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3f8,"Command xrGetInputSourceLocalizedName param getInfo is invalid",
                   &local_3f9);
        CoreValidLogMessage(pGVar2,(string *)local_390,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3b8,&local_3d8,(string *)local_3f8);
        std::__cxx11::string::~string(local_3f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3d8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    std::operator<<((ostream *)local_1e8,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_208);
    std::operator<<((ostream *)local_1e8,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"VUID-xrGetInputSourceLocalizedName-session-parameter",&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"xrGetInputSourceLocalizedName",&local_251);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_270,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_58);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_228,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_250,&local_270,local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_270);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetInputSourceLocalizedName(
XrSession session,
const XrInputSourceLocalizedNameGetInfo* getInfo,
uint32_t bufferCapacityInput,
uint32_t* bufferCountOutput,
char* buffer) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrGetInputSourceLocalizedName-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == getInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName", objects_info,
                                "Invalid NULL for XrInputSourceLocalizedNameGetInfo \"getInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrInputSourceLocalizedNameGetInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetInputSourceLocalizedName", objects_info,
                                                        true, true, getInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName",
                                objects_info,
                                "Command xrGetInputSourceLocalizedName param getInfo is invalid");
            return xr_result;
        }
        // Optional array must be non-NULL when bufferCapacityInput is non-zero
        if (0 != bufferCapacityInput && nullptr == buffer) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName",
                                objects_info,
                                "Command xrGetInputSourceLocalizedName param buffer is NULL, but bufferCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == bufferCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetInputSourceLocalizedName-bufferCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetInputSourceLocalizedName", objects_info,
                                "Invalid NULL for uint32_t \"bufferCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetInputSourceLocalizedName-bufferCountOutput-parameter" type
        // NOTE: Can't validate "VUID-xrGetInputSourceLocalizedName-buffer-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}